

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O1

void __thiscall pstore::broker::gc_watch_thread::stop(gc_watch_thread *this,int signum)

{
  long lVar1;
  undefined8 *puVar2;
  not_null<const_char_*> nVar3;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar4;
  long *in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  not_null<const_char_*> local_40;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &this->mut_;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  this->done_ = true;
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  local_40.ptr_ = "asking gc process watch thread to exit";
  gsl::not_null<const_char_*>::ensure_invariant(&local_40);
  nVar3.ptr_ = local_40.ptr_;
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar4 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar4[1];
    for (puVar4 = (undefined8 *)*puVar4; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x48))((long *)*puVar4,6,nVar3.ptr_);
    }
  }
  LOCK();
  (this->cv_).signal_.super___atomic_base<int>._M_i = signum;
  UNLOCK();
  descriptor_condition_variable::notify_all_no_except(&(this->cv_).cv_);
  return;
}

Assistant:

void gc_watch_thread::stop (int const signum) {
            {
                std::unique_lock<decltype (mut_)> const lock{mut_};
                done_ = true;
            }
            log (priority::info, "asking gc process watch thread to exit");
            cv_.notify_all (signum);
        }